

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmInstallTargetGenerator::GenerateScriptForConfig
          (cmInstallTargetGenerator *this,ostream *os,string *config,Indent indent)

{
  size_type *psVar1;
  NamelinkModeType NVar2;
  cmGeneratorTarget *this_00;
  char *permissions_dir;
  cmInstallType type_00;
  bool bVar3;
  uint uVar4;
  cmLocalGenerator *pcVar5;
  char *pcVar6;
  string *psVar7;
  string *psVar8;
  cmGlobalGenerator *this_01;
  cmake *this_02;
  cmListFileBacktrace *backtrace;
  ulong uVar9;
  size_type sVar10;
  size_type sVar11;
  char *permissions_file;
  char *literal_args_00;
  TweakMethod in_R9;
  TweakMethod tweak;
  byte local_881;
  string local_768;
  byte local_741;
  char *pcStack_740;
  bool optional;
  char *no_rename;
  char *no_dir_permissions;
  undefined8 uStack_728;
  int local_71c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_718;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6f8;
  undefined1 local_6d8 [8];
  string toRealName;
  string fromRealName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_678;
  undefined1 local_658 [8];
  string toSOName;
  string fromSOName;
  string toName;
  string fromName;
  undefined1 local_5d0 [7];
  bool haveNamelink;
  string to1_4;
  string from1_4;
  string targetNameBase;
  string to1_3;
  undefined1 local_530 [8];
  string from1_3;
  undefined1 local_4f0 [8];
  string e;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8;
  undefined1 local_488 [8];
  string targetNameImportLib_1;
  string to1_2;
  string from1_2;
  Names targetNames_1;
  string to2;
  string from2;
  string local_320;
  char *local_300;
  char *ext;
  cmMakefile *mf;
  string to1_1;
  string from1_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  undefined1 local_270 [8];
  string targetNameImportLib;
  string to1;
  string from1;
  Names targetNames;
  string literal_args;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filesTo;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filesFrom;
  undefined1 local_e0 [8];
  string toDir;
  undefined1 local_98 [4];
  ArtifactType artifact;
  string fromDirConfig;
  allocator<char> local_61;
  string local_60;
  int local_3c;
  cmInstallType local_38;
  TargetType local_34;
  cmInstallType type;
  TargetType targetType;
  string *config_local;
  ostream *os_local;
  cmInstallTargetGenerator *this_local;
  Indent indent_local;
  
  _type = config;
  config_local = (string *)os;
  os_local = (ostream *)this;
  this_local._4_4_ = indent.Level;
  local_34 = cmGeneratorTarget::GetType(this->Target);
  local_38 = cmInstallType_EXECUTABLE;
  switch(local_34) {
  case EXECUTABLE:
    local_38 = cmInstallType_EXECUTABLE;
    break;
  case STATIC_LIBRARY:
    local_38 = cmInstallType_STATIC_LIBRARY;
    break;
  case SHARED_LIBRARY:
    local_38 = cmInstallType_SHARED_LIBRARY;
    break;
  case MODULE_LIBRARY:
    local_38 = cmInstallType_MODULE_LIBRARY;
    break;
  case OBJECT_LIBRARY:
    local_3c = this_local._4_4_;
    GenerateScriptForConfigObjectLibrary(this,(ostream *)config_local,_type,this_local._4_4_);
    return;
  case UTILITY:
  case GLOBAL_TARGET:
  case UNKNOWN_LIBRARY:
    pcVar5 = cmGeneratorTarget::GetLocalGenerator(this->Target);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"cmInstallTargetGenerator created with non-installable target.",
               &local_61);
    cmLocalGenerator::IssueMessage(pcVar5,INTERNAL_ERROR,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator(&local_61);
    return;
  case INTERFACE_LIBRARY:
    __assert_fail("false && \"INTERFACE_LIBRARY targets have no installable outputs.\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmInstallTargetGenerator.cxx"
                  ,0x42,
                  "virtual void cmInstallTargetGenerator::GenerateScriptForConfig(std::ostream &, const std::string &, Indent)"
                 );
  }
  std::__cxx11::string::string((string *)local_98);
  bVar3 = cmGeneratorTarget::NeedRelinkBeforeInstall(this->Target,_type);
  if (bVar3) {
    pcVar5 = cmGeneratorTarget::GetLocalGenerator(this->Target);
    psVar8 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(pcVar5);
    std::__cxx11::string::operator=((string *)local_98,(string *)psVar8);
    std::__cxx11::string::operator+=((string *)local_98,"/CMakeFiles");
    std::__cxx11::string::operator+=((string *)local_98,"/CMakeRelink.dir/");
  }
  else {
    cmGeneratorTarget::GetDirectory
              ((string *)((long)&toDir.field_2 + 8),this->Target,_type,
               this->ImportLibrary & ImportLibraryArtifact);
    std::__cxx11::string::operator=((string *)local_98,(string *)(toDir.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(toDir.field_2._M_local_buf + 8));
    std::__cxx11::string::operator+=((string *)local_98,"/");
  }
  GetDestination((string *)
                 &filesFrom.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,this,_type);
  cmInstallGenerator::ConvertToAbsoluteDestination
            ((string *)local_e0,&this->super_cmInstallGenerator,
             (string *)
             &filesFrom.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string
            ((string *)
             &filesFrom.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::operator+=((string *)local_e0,"/");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&filesTo.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&literal_args.field_2 + 8));
  std::__cxx11::string::string((string *)(targetNames.SharedObject.field_2._M_local_buf + 8));
  if (local_34 == EXECUTABLE) {
    if (this->NamelinkMode != NamelinkModeNone) {
      __assert_fail("this->NamelinkMode == NamelinkModeNone",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmInstallTargetGenerator.cxx"
                    ,0x6c,
                    "virtual void cmInstallTargetGenerator::GenerateScriptForConfig(std::ostream &, const std::string &, Indent)"
                   );
    }
    cmGeneratorTarget::GetExecutableNames((Names *)((long)&from1.field_2 + 8),this->Target,_type);
    if ((this->ImportLibrary & 1U) == 0) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&to1_1.field_2 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&targetNames.Base.field_2 + 8));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mf,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&targetNames.Base.field_2 + 8));
      bVar3 = cmGeneratorTarget::IsAppBundleOnApple(this->Target);
      if (bVar3) {
        ext = (char *)cmTarget::GetMakefile(this->Target->Target);
        this_00 = this->Target;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_320,"BUNDLE_EXTENSION",
                   (allocator<char> *)(from2.field_2._M_local_buf + 0xf));
        pcVar6 = cmGeneratorTarget::GetProperty(this_00,&local_320);
        std::__cxx11::string::~string((string *)&local_320);
        std::allocator<char>::~allocator((allocator<char> *)(from2.field_2._M_local_buf + 0xf));
        local_300 = pcVar6;
        if (pcVar6 == (char *)0x0) {
          local_300 = "app";
        }
        local_38 = cmInstallType_DIRECTORY;
        std::__cxx11::string::operator+=
                  ((string *)(targetNames.SharedObject.field_2._M_local_buf + 8),
                   " USE_SOURCE_PERMISSIONS");
        std::__cxx11::string::operator+=((string *)(to1_1.field_2._M_local_buf + 8),".");
        std::__cxx11::string::operator+=((string *)(to1_1.field_2._M_local_buf + 8),local_300);
        std::__cxx11::string::operator+=((string *)&mf,".");
        std::__cxx11::string::operator+=((string *)&mf,local_300);
        std::__cxx11::string::operator+=((string *)&mf,"/");
        bVar3 = cmMakefile::PlatformIsAppleEmbedded((cmMakefile *)ext);
        if (!bVar3) {
          std::__cxx11::string::operator+=((string *)&mf,"Contents/MacOS/");
        }
        std::__cxx11::string::operator+=
                  ((string *)&mf,(string *)(targetNames.Base.field_2._M_local_buf + 8));
      }
      else {
        bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&targetNames.Output.field_2 + 8),
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&targetNames.Base.field_2 + 8));
        if (bVar3) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&to2.field_2 + 8),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_98,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&targetNames.Output.field_2 + 8));
          psVar7 = (string *)
                   std::__cxx11::string::operator+=
                             ((string *)local_e0,
                              (string *)(targetNames.Output.field_2._M_local_buf + 8));
          std::__cxx11::string::string
                    ((string *)(targetNames_1.SharedObject.field_2._M_local_buf + 8),psVar7);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&filesTo.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (value_type *)((long)&to2.field_2 + 8));
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)((long)&literal_args.field_2 + 8),
                      (value_type *)((long)&targetNames_1.SharedObject.field_2 + 8));
          std::__cxx11::string::~string
                    ((string *)(targetNames_1.SharedObject.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)(to2.field_2._M_local_buf + 8));
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&filesTo.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                  (value_type *)((long)&to1_1.field_2 + 8));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&literal_args.field_2 + 8),(value_type *)&mf);
      std::__cxx11::string::~string((string *)&mf);
      std::__cxx11::string::~string((string *)(to1_1.field_2._M_local_buf + 8));
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&to1.field_2 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&targetNames.Real.field_2 + 8));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&targetNameImportLib.field_2 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&targetNames.Real.field_2 + 8));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&filesTo.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                  (value_type *)((long)&to1.field_2 + 8));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&literal_args.field_2 + 8),
                  (value_type *)((long)&targetNameImportLib.field_2 + 8));
      std::__cxx11::string::string((string *)local_270);
      bVar3 = cmGeneratorTarget::GetImplibGNUtoMS
                        (this->Target,_type,(string *)((long)&targetNames.Real.field_2 + 8),
                         (string *)local_270,(char *)0x0);
      if (bVar3) {
        std::operator+(&local_290,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_270);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&filesTo.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_290);
        std::__cxx11::string::~string((string *)&local_290);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&from1_1.field_2 + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_270);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)&literal_args.field_2 + 8),(value_type *)((long)&from1_1.field_2 + 8))
        ;
        std::__cxx11::string::~string((string *)(from1_1.field_2._M_local_buf + 8));
      }
      local_38 = cmInstallType_STATIC_LIBRARY;
      std::__cxx11::string::~string((string *)local_270);
      std::__cxx11::string::~string((string *)(targetNameImportLib.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(to1.field_2._M_local_buf + 8));
    }
    cmGeneratorTarget::Names::~Names((Names *)((long)&from1.field_2 + 8));
  }
  else {
    cmGeneratorTarget::GetLibraryNames((Names *)((long)&from1_2.field_2 + 8),this->Target,_type);
    if ((this->ImportLibrary & 1U) == 0) {
      bVar3 = cmGeneratorTarget::IsFrameworkOnApple(this->Target);
      if (!bVar3) {
        bVar3 = cmGeneratorTarget::IsCFBundleOnApple(this->Target);
        if (bVar3) {
          local_38 = cmInstallType_DIRECTORY;
          std::__cxx11::string::operator+=
                    ((string *)(targetNames.SharedObject.field_2._M_local_buf + 8),
                     " USE_SOURCE_PERMISSIONS");
          psVar1 = &targetNames_1.Base.field_2._M_allocated_capacity + 1;
          std::__cxx11::string::find((char)psVar1,0x2f);
          std::__cxx11::string::substr((ulong)((long)&from1_4.field_2 + 8),(ulong)psVar1);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&to1_4.field_2 + 8),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_98,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&from1_4.field_2 + 8));
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_5d0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_e0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&targetNames_1.Base.field_2 + 8));
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&filesTo.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (value_type *)((long)&to1_4.field_2 + 8));
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)((long)&literal_args.field_2 + 8),(value_type *)local_5d0);
          std::__cxx11::string::~string((string *)local_5d0);
          std::__cxx11::string::~string((string *)(to1_4.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)(from1_4.field_2._M_local_buf + 8));
        }
        else {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&toName.field_2 + 8),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_98,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&targetNames_1.Base.field_2 + 8));
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&fromSOName.field_2 + 8),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_e0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&targetNames_1.Base.field_2 + 8));
          std::__cxx11::string::string((string *)(toSOName.field_2._M_local_buf + 8));
          std::__cxx11::string::string((string *)local_658);
          fromName.field_2._M_local_buf[0xf] =
               std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               ((long)&targetNames_1.PDB.field_2 + 8),
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               ((long)&targetNames_1.Base.field_2 + 8));
          if ((bool)fromName.field_2._M_local_buf[0xf]) {
            std::operator+(&local_678,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_98,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)((long)&targetNames_1.PDB.field_2 + 8));
            std::__cxx11::string::operator=
                      ((string *)(toSOName.field_2._M_local_buf + 8),(string *)&local_678);
            std::__cxx11::string::~string((string *)&local_678);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&fromRealName.field_2 + 8),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_e0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)((long)&targetNames_1.PDB.field_2 + 8));
            std::__cxx11::string::operator=
                      ((string *)local_658,(string *)(fromRealName.field_2._M_local_buf + 8));
            std::__cxx11::string::~string((string *)(fromRealName.field_2._M_local_buf + 8));
          }
          std::__cxx11::string::string((string *)(toRealName.field_2._M_local_buf + 8));
          std::__cxx11::string::string((string *)local_6d8);
          bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&targetNames_1.Output.field_2 + 8),
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&targetNames_1.Base.field_2 + 8));
          if ((bVar3) &&
             (bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)((long)&targetNames_1.Output.field_2 + 8),
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)((long)&targetNames_1.PDB.field_2 + 8)), bVar3)) {
            fromName.field_2._M_local_buf[0xf] = '\x01';
            std::operator+(&local_6f8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_98,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)((long)&targetNames_1.Output.field_2 + 8));
            std::__cxx11::string::operator=
                      ((string *)(toRealName.field_2._M_local_buf + 8),(string *)&local_6f8);
            std::__cxx11::string::~string((string *)&local_6f8);
            std::operator+(&local_718,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_e0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)((long)&targetNames_1.Output.field_2 + 8));
            std::__cxx11::string::operator=((string *)local_6d8,(string *)&local_718);
            std::__cxx11::string::~string((string *)&local_718);
          }
          if (fromName.field_2._M_local_buf[0xf] == '\0') {
            if (this->NamelinkMode != NamelinkModeOnly) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&filesTo.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          (value_type *)((long)&toName.field_2 + 8));
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)((long)&literal_args.field_2 + 8),
                          (value_type *)((long)&fromSOName.field_2 + 8));
            }
          }
          else if (this->NamelinkMode == NamelinkModeOnly) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&filesTo.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,
                        (value_type *)((long)&toName.field_2 + 8));
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)((long)&literal_args.field_2 + 8),
                        (value_type *)((long)&fromSOName.field_2 + 8));
          }
          else {
            uVar9 = std::__cxx11::string::empty();
            if ((uVar9 & 1) == 0) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&filesTo.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          (value_type *)((long)&toRealName.field_2 + 8));
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)((long)&literal_args.field_2 + 8),(value_type *)local_6d8);
            }
            uVar9 = std::__cxx11::string::empty();
            if ((uVar9 & 1) == 0) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&filesTo.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          (value_type *)((long)&toSOName.field_2 + 8));
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)((long)&literal_args.field_2 + 8),(value_type *)local_658);
            }
            if (this->NamelinkMode != NamelinkModeSkip) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&filesTo.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          (value_type *)((long)&toName.field_2 + 8));
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)((long)&literal_args.field_2 + 8),
                          (value_type *)((long)&fromSOName.field_2 + 8));
            }
          }
          std::__cxx11::string::~string((string *)local_6d8);
          std::__cxx11::string::~string((string *)(toRealName.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_658);
          std::__cxx11::string::~string((string *)(toSOName.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)(fromSOName.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)(toName.field_2._M_local_buf + 8));
        }
        goto LAB_0021c292;
      }
      NVar2 = this->NamelinkMode;
      if (NVar2 == NamelinkModeNone) {
LAB_0021bc27:
        local_38 = cmInstallType_DIRECTORY;
        std::__cxx11::string::operator+=
                  ((string *)(targetNames.SharedObject.field_2._M_local_buf + 8),
                   " USE_SOURCE_PERMISSIONS");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_530,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        ((long)&targetNames_1.Base.field_2 + 8));
        cmsys::SystemTools::GetFilenamePath
                  ((string *)((long)&to1_3.field_2 + 8),(string *)local_530);
        std::__cxx11::string::operator=
                  ((string *)local_530,(string *)(to1_3.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(to1_3.field_2._M_local_buf + 8));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&targetNameBase.field_2 + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        ((long)&targetNames_1.Output.field_2 + 8));
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&filesTo.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_530);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)&literal_args.field_2 + 8),
                    (value_type *)((long)&targetNameBase.field_2 + 8));
        std::__cxx11::string::~string((string *)(targetNameBase.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_530);
        goto LAB_0021c292;
      }
      if (NVar2 != NamelinkModeOnly) {
        if (NVar2 == NamelinkModeSkip) {
          psVar8 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&from1_3.field_2 + 8),"Target \'",psVar8);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_4f0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&from1_3.field_2 + 8),
                         "\' was changed to a FRAMEWORK sometime after install().  This may result in the wrong install DESTINATION.  Set the FRAMEWORK property earlier."
                        );
          std::__cxx11::string::~string((string *)(from1_3.field_2._M_local_buf + 8));
          this_01 = cmGeneratorTarget::GetGlobalGenerator(this->Target);
          this_02 = cmGlobalGenerator::GetCMakeInstance(this_01);
          backtrace = GetBacktrace(this);
          cmake::IssueMessage(this_02,AUTHOR_WARNING,(string *)local_4f0,backtrace);
          std::__cxx11::string::~string((string *)local_4f0);
        }
        goto LAB_0021bc27;
      }
      e.field_2._12_4_ = 1;
    }
    else {
      if (this->NamelinkMode != NamelinkModeNone) {
        __assert_fail("this->NamelinkMode == NamelinkModeNone",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmInstallTargetGenerator.cxx"
                      ,0xac,
                      "virtual void cmInstallTargetGenerator::GenerateScriptForConfig(std::ostream &, const std::string &, Indent)"
                     );
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&to1_2.field_2 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&targetNames_1.Real.field_2 + 8));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&targetNameImportLib_1.field_2 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&targetNames_1.Real.field_2 + 8));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&filesTo.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                  (value_type *)((long)&to1_2.field_2 + 8));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&literal_args.field_2 + 8),
                  (value_type *)((long)&targetNameImportLib_1.field_2 + 8));
      std::__cxx11::string::string((string *)local_488);
      bVar3 = cmGeneratorTarget::GetImplibGNUtoMS
                        (this->Target,_type,(string *)((long)&targetNames_1.Real.field_2 + 8),
                         (string *)local_488,(char *)0x0);
      if (bVar3) {
        std::operator+(&local_4a8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_488);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&filesTo.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_4a8);
        std::__cxx11::string::~string((string *)&local_4a8);
        std::operator+(&local_4c8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_488);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)&literal_args.field_2 + 8),&local_4c8);
        std::__cxx11::string::~string((string *)&local_4c8);
      }
      local_38 = cmInstallType_STATIC_LIBRARY;
      std::__cxx11::string::~string((string *)local_488);
      std::__cxx11::string::~string((string *)(targetNameImportLib_1.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(to1_2.field_2._M_local_buf + 8));
LAB_0021c292:
      e.field_2._12_4_ = 0;
    }
    cmGeneratorTarget::Names::~Names((Names *)((long)&from1_2.field_2 + 8));
    if (e.field_2._12_4_ != 0) goto LAB_0021c530;
  }
  sVar10 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&filesTo.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  sVar11 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&literal_args.field_2 + 8));
  if (sVar10 != sVar11) {
    __assert_fail("filesFrom.size() == filesTo.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmInstallTargetGenerator.cxx"
                  ,0x132,
                  "virtual void cmInstallTargetGenerator::GenerateScriptForConfig(std::ostream &, const std::string &, Indent)"
                 );
  }
  bVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&filesTo.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (bVar3) {
    e.field_2._12_4_ = 1;
  }
  else {
    local_71c = this_local._4_4_;
    no_dir_permissions = (char *)PreReplacementTweaks;
    uStack_728 = 0;
    AddTweak(this,(ostream *)config_local,this_local._4_4_,_type,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&literal_args.field_2 + 8),in_R9);
    psVar8 = config_local;
    no_rename = (char *)0x0;
    pcStack_740 = (char *)0x0;
    local_881 = 1;
    if ((this->Optional & 1U) == 0) {
      local_881 = this->ImportLibrary;
    }
    local_741 = local_881 & 1;
    GetDestination(&local_768,this,_type);
    type_00 = local_38;
    uVar4 = (uint)local_741;
    permissions_file = (char *)std::__cxx11::string::c_str();
    permissions_dir = no_rename;
    pcVar6 = pcStack_740;
    literal_args_00 = (char *)std::__cxx11::string::c_str();
    tweak = (TweakMethod)(uVar4 & 1);
    cmInstallGenerator::AddInstallRule
              (&this->super_cmInstallGenerator,(ostream *)psVar8,&local_768,type_00,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&filesTo.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,SUB41(uVar4 & 1,0),
               permissions_file,permissions_dir,pcVar6,literal_args_00,this_local._4_4_);
    std::__cxx11::string::~string((string *)&local_768);
    AddTweak(this,(ostream *)config_local,this_local._4_4_,_type,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&literal_args.field_2 + 8),tweak);
    e.field_2._12_4_ = 0;
  }
LAB_0021c530:
  std::__cxx11::string::~string((string *)(targetNames.SharedObject.field_2._M_local_buf + 8));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&literal_args.field_2 + 8));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&filesTo.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)local_e0);
  std::__cxx11::string::~string((string *)local_98);
  return;
}

Assistant:

void cmInstallTargetGenerator::GenerateScriptForConfig(
  std::ostream& os, const std::string& config, Indent indent)
{
  cmStateEnums::TargetType targetType = this->Target->GetType();
  cmInstallType type = cmInstallType();
  switch (targetType) {
    case cmStateEnums::EXECUTABLE:
      type = cmInstallType_EXECUTABLE;
      break;
    case cmStateEnums::STATIC_LIBRARY:
      type = cmInstallType_STATIC_LIBRARY;
      break;
    case cmStateEnums::SHARED_LIBRARY:
      type = cmInstallType_SHARED_LIBRARY;
      break;
    case cmStateEnums::MODULE_LIBRARY:
      type = cmInstallType_MODULE_LIBRARY;
      break;
    case cmStateEnums::INTERFACE_LIBRARY:
      // Not reachable. We never create a cmInstallTargetGenerator for
      // an INTERFACE_LIBRARY.
      assert(false &&
             "INTERFACE_LIBRARY targets have no installable outputs.");
      break;

    case cmStateEnums::OBJECT_LIBRARY:
      this->GenerateScriptForConfigObjectLibrary(os, config, indent);
      return;

    case cmStateEnums::UTILITY:
    case cmStateEnums::GLOBAL_TARGET:
    case cmStateEnums::UNKNOWN_LIBRARY:
      this->Target->GetLocalGenerator()->IssueMessage(
        MessageType::INTERNAL_ERROR,
        "cmInstallTargetGenerator created with non-installable target.");
      return;
  }

  // Compute the build tree directory from which to copy the target.
  std::string fromDirConfig;
  if (this->Target->NeedRelinkBeforeInstall(config)) {
    fromDirConfig =
      this->Target->GetLocalGenerator()->GetCurrentBinaryDirectory();
    fromDirConfig += "/CMakeFiles";
    fromDirConfig += "/CMakeRelink.dir/";
  } else {
    cmStateEnums::ArtifactType artifact = this->ImportLibrary
      ? cmStateEnums::ImportLibraryArtifact
      : cmStateEnums::RuntimeBinaryArtifact;
    fromDirConfig = this->Target->GetDirectory(config, artifact);
    fromDirConfig += "/";
  }

  std::string toDir =
    this->ConvertToAbsoluteDestination(this->GetDestination(config));
  toDir += "/";

  // Compute the list of files to install for this target.
  std::vector<std::string> filesFrom;
  std::vector<std::string> filesTo;
  std::string literal_args;

  if (targetType == cmStateEnums::EXECUTABLE) {
    // There is a bug in cmInstallCommand if this fails.
    assert(this->NamelinkMode == NamelinkModeNone);

    cmGeneratorTarget::Names targetNames =
      this->Target->GetExecutableNames(config);
    if (this->ImportLibrary) {
      std::string from1 = fromDirConfig + targetNames.ImportLibrary;
      std::string to1 = toDir + targetNames.ImportLibrary;
      filesFrom.push_back(std::move(from1));
      filesTo.push_back(std::move(to1));
      std::string targetNameImportLib;
      if (this->Target->GetImplibGNUtoMS(config, targetNames.ImportLibrary,
                                         targetNameImportLib)) {
        filesFrom.push_back(fromDirConfig + targetNameImportLib);
        filesTo.push_back(toDir + targetNameImportLib);
      }

      // An import library looks like a static library.
      type = cmInstallType_STATIC_LIBRARY;
    } else {
      std::string from1 = fromDirConfig + targetNames.Output;
      std::string to1 = toDir + targetNames.Output;

      // Handle OSX Bundles.
      if (this->Target->IsAppBundleOnApple()) {
        cmMakefile const* mf = this->Target->Target->GetMakefile();

        // Get App Bundle Extension
        const char* ext = this->Target->GetProperty("BUNDLE_EXTENSION");
        if (!ext) {
          ext = "app";
        }

        // Install the whole app bundle directory.
        type = cmInstallType_DIRECTORY;
        literal_args += " USE_SOURCE_PERMISSIONS";
        from1 += ".";
        from1 += ext;

        // Tweaks apply to the binary inside the bundle.
        to1 += ".";
        to1 += ext;
        to1 += "/";
        if (!mf->PlatformIsAppleEmbedded()) {
          to1 += "Contents/MacOS/";
        }
        to1 += targetNames.Output;
      } else {
        // Tweaks apply to the real file, so list it first.
        if (targetNames.Real != targetNames.Output) {
          std::string from2 = fromDirConfig + targetNames.Real;
          std::string to2 = toDir += targetNames.Real;
          filesFrom.push_back(std::move(from2));
          filesTo.push_back(std::move(to2));
        }
      }

      filesFrom.push_back(std::move(from1));
      filesTo.push_back(std::move(to1));
    }
  } else {
    cmGeneratorTarget::Names targetNames =
      this->Target->GetLibraryNames(config);
    if (this->ImportLibrary) {
      // There is a bug in cmInstallCommand if this fails.
      assert(this->NamelinkMode == NamelinkModeNone);

      std::string from1 = fromDirConfig + targetNames.ImportLibrary;
      std::string to1 = toDir + targetNames.ImportLibrary;
      filesFrom.push_back(std::move(from1));
      filesTo.push_back(std::move(to1));
      std::string targetNameImportLib;
      if (this->Target->GetImplibGNUtoMS(config, targetNames.ImportLibrary,
                                         targetNameImportLib)) {
        filesFrom.push_back(fromDirConfig + targetNameImportLib);
        filesTo.push_back(toDir + targetNameImportLib);
      }

      // An import library looks like a static library.
      type = cmInstallType_STATIC_LIBRARY;
    } else if (this->Target->IsFrameworkOnApple()) {
      // FIXME: In principle we should be able to
      //   assert(this->NamelinkMode == NamelinkModeNone);
      // but since the current install() command implementation checks
      // the FRAMEWORK property immediately instead of delaying until
      // generate time, it is possible for project code to set the
      // property after calling install().  In such a case, the install()
      // command will use the LIBRARY code path and create two install
      // generators, one for the namelink component (NamelinkModeOnly)
      // and one for the primary artifact component (NamelinkModeSkip).
      // Historically this was not diagnosed and resulted in silent
      // installation of a framework to the LIBRARY destination.
      // Retain that behavior and warn about the case.
      switch (this->NamelinkMode) {
        case NamelinkModeNone:
          // Normal case.
          break;
        case NamelinkModeOnly:
          // Assume the NamelinkModeSkip instance will warn and install.
          return;
        case NamelinkModeSkip: {
          std::string e = "Target '" + this->Target->GetName() +
            "' was changed to a FRAMEWORK sometime after install().  "
            "This may result in the wrong install DESTINATION.  "
            "Set the FRAMEWORK property earlier.";
          this->Target->GetGlobalGenerator()->GetCMakeInstance()->IssueMessage(
            MessageType::AUTHOR_WARNING, e, this->GetBacktrace());
        } break;
      }

      // Install the whole framework directory.
      type = cmInstallType_DIRECTORY;
      literal_args += " USE_SOURCE_PERMISSIONS";

      std::string from1 = fromDirConfig + targetNames.Output;
      from1 = cmSystemTools::GetFilenamePath(from1);

      // Tweaks apply to the binary inside the bundle.
      std::string to1 = toDir + targetNames.Real;

      filesFrom.push_back(std::move(from1));
      filesTo.push_back(std::move(to1));
    } else if (this->Target->IsCFBundleOnApple()) {
      // Install the whole app bundle directory.
      type = cmInstallType_DIRECTORY;
      literal_args += " USE_SOURCE_PERMISSIONS";

      std::string targetNameBase =
        targetNames.Output.substr(0, targetNames.Output.find('/'));

      std::string from1 = fromDirConfig + targetNameBase;
      std::string to1 = toDir + targetNames.Output;

      filesFrom.push_back(std::move(from1));
      filesTo.push_back(std::move(to1));
    } else {
      bool haveNamelink = false;

      // Library link name.
      std::string fromName = fromDirConfig + targetNames.Output;
      std::string toName = toDir + targetNames.Output;

      // Library interface name.
      std::string fromSOName;
      std::string toSOName;
      if (targetNames.SharedObject != targetNames.Output) {
        haveNamelink = true;
        fromSOName = fromDirConfig + targetNames.SharedObject;
        toSOName = toDir + targetNames.SharedObject;
      }

      // Library implementation name.
      std::string fromRealName;
      std::string toRealName;
      if (targetNames.Real != targetNames.Output &&
          targetNames.Real != targetNames.SharedObject) {
        haveNamelink = true;
        fromRealName = fromDirConfig + targetNames.Real;
        toRealName = toDir + targetNames.Real;
      }

      // Add the names based on the current namelink mode.
      if (haveNamelink) {
        // With a namelink we need to check the mode.
        if (this->NamelinkMode == NamelinkModeOnly) {
          // Install the namelink only.
          filesFrom.push_back(fromName);
          filesTo.push_back(toName);
        } else {
          // Install the real file if it has its own name.
          if (!fromRealName.empty()) {
            filesFrom.push_back(fromRealName);
            filesTo.push_back(toRealName);
          }

          // Install the soname link if it has its own name.
          if (!fromSOName.empty()) {
            filesFrom.push_back(fromSOName);
            filesTo.push_back(toSOName);
          }

          // Install the namelink if it is not to be skipped.
          if (this->NamelinkMode != NamelinkModeSkip) {
            filesFrom.push_back(fromName);
            filesTo.push_back(toName);
          }
        }
      } else {
        // Without a namelink there will be only one file.  Install it
        // if this is not a namelink-only rule.
        if (this->NamelinkMode != NamelinkModeOnly) {
          filesFrom.push_back(fromName);
          filesTo.push_back(toName);
        }
      }
    }
  }

  // If this fails the above code is buggy.
  assert(filesFrom.size() == filesTo.size());

  // Skip this rule if no files are to be installed for the target.
  if (filesFrom.empty()) {
    return;
  }

  // Add pre-installation tweaks.
  this->AddTweak(os, indent, config, filesTo,
                 &cmInstallTargetGenerator::PreReplacementTweaks);

  // Write code to install the target file.
  const char* no_dir_permissions = nullptr;
  const char* no_rename = nullptr;
  bool optional = this->Optional || this->ImportLibrary;
  this->AddInstallRule(os, this->GetDestination(config), type, filesFrom,
                       optional, this->FilePermissions.c_str(),
                       no_dir_permissions, no_rename, literal_args.c_str(),
                       indent);

  // Add post-installation tweaks.
  this->AddTweak(os, indent, config, filesTo,
                 &cmInstallTargetGenerator::PostReplacementTweaks);
}